

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O0

void basisu::mul_image(imagef *src1,imagef *src2,imagef *dst,vec4F *scale)

{
  uint32_t uVar1;
  float *pfVar2;
  vec4F *this;
  imagef *in_RDX;
  imagef *in_RDI;
  float fVar3;
  float fVar4;
  float v2;
  float v1;
  uint32_t c;
  vec4F d;
  vec4F *s2;
  vec4F *s1;
  uint32_t x;
  int y;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff84;
  int iVar6;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar7;
  vec<4U,_float> local_58;
  vec4F *local_48;
  vec4F *local_40;
  uint local_38;
  int local_34;
  imagef *local_18;
  
  local_18 = in_RDX;
  vec<4U,_float>::vec((vec<4U,_float> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,0.0,7.577684e-39);
  imagef::resize((imagef *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (imagef *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (uint32_t)((ulong)in_RDI >> 0x20),(vec4F *)in_RDX);
  local_34 = 0;
  while( true ) {
    iVar6 = local_34;
    uVar1 = imagef::get_height(local_18);
    if ((int)uVar1 <= iVar6) break;
    local_38 = 0;
    while( true ) {
      uVar5 = local_38;
      uVar1 = imagef::get_width(local_18);
      if (uVar1 <= uVar5) break;
      local_40 = imagef::operator()(in_RDI,(uint32_t)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX);
      local_48 = imagef::operator()(in_RDI,(uint32_t)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX);
      vec<4U,_float>::vec(&local_58);
      for (uVar7 = 0; uVar7 < 4; uVar7 = uVar7 + 1) {
        fVar3 = vec<4U,_float>::operator[]
                          ((vec<4U,_float> *)CONCAT44(iVar6,uVar5),
                           (uint32_t)in_stack_ffffffffffffff7c);
        fVar4 = vec<4U,_float>::operator[]
                          ((vec<4U,_float> *)CONCAT44(iVar6,uVar5),
                           (uint32_t)in_stack_ffffffffffffff7c);
        fVar3 = fVar3 * fVar4;
        fVar4 = vec<4U,_float>::operator[]
                          ((vec<4U,_float> *)CONCAT44(iVar6,uVar5),
                           (uint32_t)in_stack_ffffffffffffff7c);
        in_stack_ffffffffffffff7c = fVar3 * fVar4;
        pfVar2 = vec<4U,_float>::operator[]
                           ((vec<4U,_float> *)CONCAT44(iVar6,uVar5),
                            (uint32_t)in_stack_ffffffffffffff7c);
        *pfVar2 = in_stack_ffffffffffffff7c;
      }
      this = imagef::operator()(in_RDI,(uint32_t)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX);
      vec<4U,_float>::operator=(this,&local_58);
      local_38 = local_38 + 1;
    }
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void mul_image(const imagef &src1, const imagef &src2, imagef &dst, const vec4F &scale)
	{
		dst.resize(src1);

//#pragma omp parallel for
		for (int y = 0; y < (int)dst.get_height(); y++)
		{
			for (uint32_t x = 0; x < dst.get_width(); x++)
			{
				const vec4F &s1 = src1(x, y);
				const vec4F &s2 = src2(x, y);

				vec4F d;

				for (uint32_t c = 0; c < 4; c++)
				{
					float v1 = s1[c];
					float v2 = s2[c];
					d[c] = v1 * v2 * scale[c];
				}

				dst(x, y) = d;
			}
		}
	}